

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void ot::commissioner::from_json(Json *aJson,Timestamp *aTimestamp)

{
  Timestamp *pTVar1;
  const_reference pvVar2;
  unsigned_long uVar3;
  allocator local_99;
  key_type local_98;
  allocator local_71;
  key_type local_70;
  allocator local_39;
  key_type local_38;
  Timestamp *local_18;
  Timestamp *aTimestamp_local;
  Json *aJson_local;
  
  local_18 = aTimestamp;
  aTimestamp_local = (Timestamp *)aJson;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"Seconds",&local_39);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(aJson,&local_38);
  uVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<unsigned_long,_unsigned_long,_0>(pvVar2);
  *local_18 = (Timestamp)((ulong)*(ushort *)&local_18->field_0x6 << 0x30 | uVar3 & 0xffffffffffff);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pTVar1 = aTimestamp_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"Ticks",&local_71);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)pTVar1,&local_70);
  uVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<unsigned_long,_unsigned_long,_0>(pvVar2);
  *local_18 = (Timestamp)
              ((ulong)*local_18 & 0x8000ffffffffffff | (ulong)((uint)uVar3 & 0x7fff) << 0x30);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  pTVar1 = aTimestamp_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"U",&local_99);
  pvVar2 = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)pTVar1,&local_98);
  uVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<unsigned_long,_unsigned_long,_0>(pvVar2);
  *local_18 = (Timestamp)((ulong)*local_18 & 0x7fffffffffffffff | uVar3 << 0x3f);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  return;
}

Assistant:

static void from_json(const Json &aJson, Timestamp &aTimestamp)
{
#define SET(name) aTimestamp.m##name = aJson.at(#name).get<uint64_t>();

    SET(Seconds);
    SET(Ticks);
    SET(U);

#undef SET
}